

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O2

void __thiscall Am_Value_List::Move_Nth(Am_Value_List *this,int index)

{
  Am_Value_List_Data *pAVar1;
  Am_List_Item **ppAVar2;
  ostream *poVar3;
  int iVar4;
  bool bVar5;
  
  pAVar1 = this->data;
  if (pAVar1 == (Am_Value_List_Data *)0x0) {
    Am_Error("Value list is empty in Move_Nth");
  }
  if (index < (int)(uint)*(ushort *)&(pAVar1->super_Am_Wrapper).field_0xc) {
    ppAVar2 = &pAVar1->head;
    iVar4 = 0;
    if (0 < index) {
      iVar4 = index;
    }
    while( true ) {
      bVar5 = iVar4 == 0;
      iVar4 = iVar4 + -1;
      if (bVar5) break;
      ppAVar2 = &(*ppAVar2)->next;
    }
    this->item = *ppAVar2;
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
  poVar3 = std::operator<<(poVar3,"Value list is too short, len = ");
  poVar3 = (ostream *)
           std::ostream::operator<<(poVar3,*(ushort *)&(this->data->super_Am_Wrapper).field_0xc);
  poVar3 = std::operator<<(poVar3," but requested ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,index);
  std::endl<char,std::char_traits<char>>(poVar3);
  Am_Error();
}

Assistant:

void
Am_Value_List::Move_Nth(int index)
{
  if (!data)
    Am_Error("Value list is empty in Move_Nth");
  Am_List_Item *this_item = data->head;
  if (index >= data->number)
    Am_ERROR("Value list is too short, len = " << data->number
                                               << " but requested " << index);
  for (int i = 0; i < index; i++) {
    this_item = this_item->next;
  }
  item = this_item;
}